

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O1

void Timidity::Renderer::compute_pan(double pan,int type,float *left_offset,float *right_offset)

{
  double dVar1;
  
  if (pan <= 0.0) {
    *left_offset = 1.0;
    *right_offset = 0.0;
  }
  else if (0.9921875 <= pan) {
    *left_offset = 0.0;
    *right_offset = 1.0;
  }
  else if (type == 0) {
    dVar1 = log(pan);
    dVar1 = exp2(dVar1 * 0.7213475204444817);
    *right_offset = (float)dVar1;
    dVar1 = log(1.0 - pan);
    dVar1 = exp2(dVar1 * 0.7213475204444817);
    *left_offset = (float)dVar1;
  }
  else {
    *left_offset = (float)SQRT(1.0 - pan);
    *right_offset = (float)SQRT(pan);
  }
  return;
}

Assistant:

void Renderer::compute_pan(double pan, int type, float &left_offset, float &right_offset)
{
	if (pan <= 0)
	{
		left_offset = 1;
		right_offset = 0;
	}
	else if (pan >= 127/128.0)
	{
		left_offset = 0;
		right_offset = 1;
	}
	else
	{
		if (type == INST_GUS)
		{
			/* Original amp equation looks like this:
			 *    calc_gf1_amp(atten + offset)
			 * which expands to:
			 *    2^(16*(atten + offset) - 16)
			 * Keeping in mind that 2^(x + y) == 2^x * 2^y, we can
			 * rewrite this to avoid doing two pows in GF1Envelope::ApplyToAmp():
			 *    2^(16*atten + 16*offset - 16)
			 *    2^(16*atten - 16 + 16 * offset + 16 - 16)
			 *    2^(16*atten - 16) * 2^(16*offset + 16 - 16)
			 *    2^(16*atten - 16) * 2^(16*(offset + 1) - 16)
			 *    calc_gf1_amp(atten) * calc_gf1_amp(offset + 1)
			 */
			right_offset = (float)calc_gf1_amp((log(pan) * (1 / (log_of_2 * 32))) + 1);
			left_offset = (float)calc_gf1_amp((log(1 - pan) * (1 / (log_of_2 * 32))) + 1);
		}
		else
		{
			/* Equal Power Panning for SF2/DLS.
			 */
			left_offset = (float)sqrt(1 - pan);
			right_offset = (float)sqrt(pan);
		}
	}
}